

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O1

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:198:29)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:198:29)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  pointer *ppSVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Results *pRVar7;
  pointer pcVar8;
  iterator iVar9;
  pointer pSVar10;
  size_t sVar11;
  undefined8 uVar12;
  Out<Enhedron::Test::Impl::Impl_Suite::WhenRunner> OVar13;
  bool bVar14;
  StackElement *element;
  void *pvVar15;
  string *psVar16;
  long lVar17;
  float result_a;
  float result_d;
  float result_c;
  float result_b;
  float result_a_1;
  Finally stack;
  Finally stack_1;
  ulong *local_440;
  undefined8 local_438;
  ulong local_430;
  undefined8 uStack_428;
  BaseFunctor **local_420;
  undefined8 local_418;
  BaseFunctor *local_410;
  undefined8 uStack_408;
  string local_400;
  int local_3e0;
  float local_3dc [5];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  _Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false> local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  ulong local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  Finally local_388;
  string local_378;
  ulong local_358;
  undefined1 local_350 [120];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined8 uStack_2c0;
  ContextResultsRecorder *local_2b8;
  string *local_2b0;
  Stats *local_2a8;
  NameStack *local_2a0;
  Finally local_298;
  Finally local_288;
  Check local_278;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined7 uStack_237;
  undefined8 uStack_230;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>
  local_228;
  StackElement local_118;
  StackElement local_108;
  BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>
  local_f8;
  
  psVar16 = &this->name;
  pRVar7 = ((results.value)->results_).value;
  local_2a0 = &(results.value)->contextStack_;
  (*pRVar7->_vptr_Results[5])(pRVar7,local_2a0,psVar16);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar14 = included(this,pathList,depth);
  if (bVar14) {
    pcVar8 = (this->name)._M_dataplus._M_p;
    local_248 = &local_238;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,pcVar8,pcVar8 + (this->name)._M_string_length);
    local_350._96_8_ = local_240;
    local_350._0_8_ = &PTR__WhenRunner_0016ec28;
    local_350._16_8_ = 0;
    local_350._24_8_ = 0;
    local_350._32_8_ = 0;
    local_350._40_8_ = 0;
    local_350._48_8_ = (void *)0x0;
    local_350._64_8_ = 0;
    if (local_248 == &local_238) {
      local_228.lhs._8_8_ = uStack_230;
      local_228.operatorName = (char *)((long)&local_228 + 0x10);
    }
    else {
      local_228.operatorName = local_248;
    }
    local_228.lhs.operatorName = (char *)CONCAT71(uStack_237,local_238);
    local_228._8_8_ = local_240;
    local_240 = 0;
    local_238 = '\0';
    local_350._88_8_ = local_350 + 0x68;
    local_350._72_8_ = &PTR__WhenResultRecorder_0016ec78;
    if (local_228.operatorName == (char *)((long)&local_228 + 0x10)) {
      local_350._112_8_ = local_228.lhs._8_8_;
    }
    else {
      local_350._88_8_ = local_228.operatorName;
    }
    local_350._104_8_ = local_228.lhs.operatorName;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_350._56_8_ = (void *)0x0;
    uStack_2c0 = 0;
    pvVar15 = (void *)local_350._48_8_;
    local_248 = &local_238;
    local_2a8 = __return_storage_ptr__;
    local_2b0 = psVar16;
    local_2b8 = results.value;
    local_350._80_8_ = results.value;
    local_350._8_8_ = 1;
    do {
      for (; pvVar15 != (void *)local_350._56_8_; pvVar15 = (void *)((long)pvVar15 + 0x10)) {
        *(undefined8 *)((long)pvVar15 + 8) = 0;
      }
      local_278.whenRunner_.value = (WhenRunner *)local_350;
      local_278.stats_.checks_ = 0;
      local_278.stats_.failedTests_ = 0;
      local_278.stats_.fixtures_ = 0;
      local_278.stats_.tests_ = 0;
      local_278.stats_.failedChecks_ = 0;
      local_388.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )(__uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
              )0x25;
      local_420 = &local_410;
      local_3c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)::std::__cxx11::string::_M_create((ulong *)&local_420,(ulong)&local_388);
      OVar13.value = local_278.whenRunner_.value;
      *(undefined8 *)(local_3c8->_M_local_buf + 0x10) = 0x20736920656e6f20;
      *(undefined8 *)(local_3c8->_M_local_buf + 0x18) = 0x76206f72657a2061;
      local_3c8->_M_allocated_capacity = 0x747361656c207461;
      *(undefined8 *)(local_3c8->_M_local_buf + 8) = 0x6d65687420666f20;
      *(char *)((long)local_3c8 + 0x1d) = 'o';
      *(char *)((long)local_3c8 + 0x1e) = ' ';
      *(char *)((long)local_3c8 + 0x1f) = 'v';
      *(char *)((long)local_3c8 + 0x20) = 'e';
      *(char *)((long)local_3c8 + 0x21) = 'c';
      *(char *)((long)local_3c8 + 0x22) = 't';
      *(char *)((long)local_3c8 + 0x23) = 'o';
      *(char *)((long)local_3c8 + 0x24) = 'r';
      local_3c8->_M_local_buf
      [(long)local_388.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl] = '\0';
      if (local_3c8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_410) {
        local_3b8._8_8_ = uStack_408;
        local_3c8 = &local_3b8;
      }
      local_3b8._M_allocated_capacity =
           (size_type)
           local_388.functor._M_t.
           super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           ._M_t.
           super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl;
      local_3c0._M_head_impl =
           (BaseFunctor *)
           local_388.functor._M_t.
           super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           ._M_t.
           super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
           .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl;
      local_418 = 0;
      local_410 = (BaseFunctor *)
                  ((ulong)local_388.functor._M_t.
                          super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
                          .
                          super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>
                          ._M_head_impl & 0xffffffffffffff00);
      iVar9._M_current =
           ((local_278.whenRunner_.value)->whenStack).
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_420 = &local_410;
      if ((ulong)((long)iVar9._M_current -
                  (long)((local_278.whenRunner_.value)->whenStack).
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <=
          (local_278.whenRunner_.value)->whenDepth_) {
        local_118.index = 0;
        local_118.current = 0;
        if (iVar9._M_current ==
            ((local_278.whenRunner_.value)->whenStack).
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    (&(local_278.whenRunner_.value)->whenStack,iVar9,&local_118);
        }
        else {
          (iVar9._M_current)->index = 0;
          (iVar9._M_current)->current = 0;
          ppSVar1 = &((local_278.whenRunner_.value)->whenStack).
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
      local_298.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      ((BaseFunctor *)
      local_298.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl)->
      _vptr_BaseFunctor = (_func_int **)&PTR__BaseFunctor_0016e498;
      ((BaseFunctor *)
      ((long)local_298.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)OVar13.value;
      local_298.valid = true;
      pSVar10 = ((OVar13.value)->whenStack).
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = (OVar13.value)->whenDepth_;
      if (pSVar10[sVar11].index == pSVar10[sVar11].current) {
        (OVar13.value)->whenDepth_ = sVar11 + 1;
        local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
        if (local_3c8 == &local_3b8) {
          local_400.field_2._8_8_ = local_3b8._8_8_;
        }
        else {
          local_400._M_dataplus._M_p = (pointer)local_3c8;
        }
        local_400.field_2._M_allocated_capacity = local_3b8._M_allocated_capacity;
        local_400._M_string_length = (size_type)local_3c0._M_head_impl;
        local_3c0._M_head_impl = (BaseFunctor *)0x0;
        local_3b8._M_allocated_capacity = local_3b8._M_allocated_capacity & 0xffffffffffffff00;
        local_3c8 = &local_3b8;
        WhenResultRecorder::push(&(OVar13.value)->whenResultRecorder_,&local_400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_400._M_dataplus._M_p != &local_400.field_2) {
          operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
        }
        local_388.functor._M_t.
        super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        ._M_t.
        super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
        .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
              )operator_new(0x10);
        *(undefined ***)
         local_388.functor._M_t.
         super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         ._M_t.
         super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
         .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
             &PTR__BaseFunctor_0016e4d8;
        ((BaseFunctor *)
        ((long)local_388.functor._M_t.
               super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               ._M_t.
               super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
               .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
               _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)OVar13.value;
        local_388.valid = true;
        local_3dc[0] = 0.0;
        local_3e0 = 0;
        local_f8.lhs.operatorName = "&&";
        local_f8.lhs.lhs.operatorName = "&&";
        local_f8.lhs.lhs.lhs.operatorName = "==";
        local_f8.lhs.lhs.lhs.lhs.variableName = "result_a";
        local_f8.lhs.lhs.lhs.lhs.value = local_3dc;
        local_f8.lhs.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.lhs.lhs.lhs.line = 0xd3;
        local_f8.lhs.lhs.lhs.rhs.value = &local_3e0;
        local_f8.lhs.lhs.rhs.variableName = "result_b == 0";
        local_f8.lhs.lhs.rhs.value = true;
        local_f8.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.lhs.rhs.line = 0xd3;
        local_f8.lhs.rhs.variableName = "result_c == 0";
        local_f8.lhs.rhs.value = true;
        local_f8.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.lhs.rhs.line = 0xd4;
        local_f8.rhs.variableName = "result_d == 0";
        local_f8.rhs.value = true;
        local_f8.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_f8.rhs.line = 0xd4;
        local_f8.operatorName = "&&";
        Check::
        operator()<const_char_(&)[22],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::Literal<int>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>_>_>
                  (&local_278,(char (*) [22])"cross product is zero",&local_f8);
        Enhedron::Impl::Util::Finally::~Finally(&local_388);
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_298);
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8._M_allocated_capacity + 1);
      }
      if (local_420 != &local_410) {
        operator_delete(local_420,(ulong)((long)&local_410->_vptr_BaseFunctor + 1));
      }
      local_358 = 0x13;
      local_440 = &local_430;
      local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)::std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)&local_358);
      OVar13.value = local_278.whenRunner_.value;
      local_3a8->_M_allocated_capacity = 0x687420726568746f;
      *(undefined8 *)(local_3a8->_M_local_buf + 8) = 0x7061682073676e69;
      *(char *)((long)local_3a8->_M_local_buf + 0xf) = 'p';
      *(char *)((long)local_3a8 + 0x10) = 'p';
      *(char *)((long)local_3a8 + 0x11) = 'e';
      *(char *)((long)local_3a8 + 0x12) = 'n';
      local_3a8->_M_local_buf[local_358] = '\0';
      if (local_3a8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_430) {
        local_398._8_8_ = uStack_428;
        local_3a8 = &local_398;
      }
      local_398._M_allocated_capacity = local_358;
      local_3a0 = local_358;
      local_438 = 0;
      local_430 = local_358 & 0xffffffffffffff00;
      iVar9._M_current =
           ((local_278.whenRunner_.value)->whenStack).
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_440 = &local_430;
      if ((ulong)((long)iVar9._M_current -
                  (long)((local_278.whenRunner_.value)->whenStack).
                        super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <=
          (local_278.whenRunner_.value)->whenDepth_) {
        local_108.index = 0;
        local_108.current = 0;
        if (iVar9._M_current ==
            ((local_278.whenRunner_.value)->whenStack).
            super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
          ::_M_realloc_insert<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>
                    (&(local_278.whenRunner_.value)->whenStack,iVar9,&local_108);
        }
        else {
          (iVar9._M_current)->index = 0;
          (iVar9._M_current)->current = 0;
          ppSVar1 = &((local_278.whenRunner_.value)->whenStack).
                     super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
      }
      local_288.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl =
           (__uniq_ptr_data<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>,_true,_true>
            )operator_new(0x10);
      ((BaseFunctor *)
      local_288.functor._M_t.
      super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      ._M_t.
      super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
      .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>._M_head_impl)->
      _vptr_BaseFunctor = (_func_int **)&PTR__BaseFunctor_0016e518;
      ((BaseFunctor *)
      ((long)local_288.functor._M_t.
             super___uniq_ptr_impl<Enhedron::Impl::Util::Finally::BaseFunctor,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_std::default_delete<Enhedron::Impl::Util::Finally::BaseFunctor>_>
             .super__Head_base<0UL,_Enhedron::Impl::Util::Finally::BaseFunctor_*,_false>.
             _M_head_impl + 8))->_vptr_BaseFunctor = (_func_int **)OVar13.value;
      local_288.valid = true;
      pSVar10 = ((OVar13.value)->whenStack).
                super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar11 = (OVar13.value)->whenDepth_;
      if (pSVar10[sVar11].index == pSVar10[sVar11].current) {
        (OVar13.value)->whenDepth_ = sVar11 + 1;
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        if (local_3a8 == &local_398) {
          local_378.field_2._8_8_ = local_398._8_8_;
        }
        else {
          local_378._M_dataplus._M_p = (pointer)local_3a8;
        }
        local_378.field_2._M_allocated_capacity = local_398._M_allocated_capacity;
        local_378._M_string_length = local_3a0;
        local_3a0 = 0;
        local_398._M_allocated_capacity = local_398._M_allocated_capacity & 0xffffffffffffff00;
        local_3a8 = &local_398;
        WhenResultRecorder::push(&(OVar13.value)->whenResultRecorder_,&local_378);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        local_400._M_dataplus._M_p = (pointer)operator_new(0x10);
        *(undefined ***)local_400._M_dataplus._M_p = &PTR__BaseFunctor_0016e558;
        *(WhenRunner **)(local_400._M_dataplus._M_p + 8) = OVar13.value;
        local_400._M_string_length = CONCAT71(local_400._M_string_length._1_7_,1);
        local_3dc[4] = 0.0;
        local_3dc[3] = 0.0;
        local_3dc[2] = 60.0;
        local_3dc[1] = 0.0;
        local_228.lhs.operatorName = "&&";
        local_228.lhs.lhs.operatorName = "==";
        local_228.lhs.lhs.lhs.variableName = "result_a";
        local_228.lhs.lhs.lhs.value = local_3dc + 4;
        local_228.lhs.lhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.lhs.lhs.line = 0xe0;
        local_228.lhs.lhs.rhs.variableName = "result_d";
        local_228.lhs.lhs.rhs.value = local_3dc + 1;
        local_228.lhs.lhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.lhs.rhs.line = 0xe0;
        local_228.lhs.rhs.operatorName = "==";
        local_228.lhs.rhs.lhs.variableName = "result_c";
        local_228.lhs.rhs.lhs.value = local_3dc + 2;
        local_228.lhs.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.rhs.lhs.line = 0xe1;
        local_228.lhs.rhs.rhs.variableName = "-result_e";
        local_228.lhs.rhs.rhs.value = 60.0;
        local_228.lhs.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.lhs.rhs.rhs.line = 0xe1;
        local_228.rhs.operatorName = "==";
        local_228.rhs.lhs.variableName = "result_b";
        local_228.rhs.lhs.value = local_3dc + 3;
        local_228.rhs.lhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.rhs.lhs.line = 0xe2;
        local_228.rhs.rhs.variableName = "-result_a";
        local_228.rhs.rhs.value = -0.0;
        local_228.rhs.rhs.file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp"
        ;
        local_228.rhs.rhs.line = 0xe2;
        local_228.operatorName = "&&";
        Check::
        operator()<const_char_(&)[29],_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1082:28),_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>,_Enhedron::Assertion::Impl::Configurable::BinaryOperator<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_MosquitoNet_cpp_single_include_MosquitoNet_h:1052:28),_Enhedron::Assertion::Impl::Configurable::VariableRefExpression<const_float>,_Enhedron::Assertion::Impl::Configurable::VariableValueExpression<float>_>_>_>
                  (&local_278,(char (*) [29])"it yields the correct result",&local_228);
        Enhedron::Impl::Util::Finally::~Finally((Finally *)&local_400);
      }
      Enhedron::Impl::Util::Finally::~Finally(&local_288);
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,local_398._M_allocated_capacity + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      bVar14 = local_350._48_8_ == local_350._56_8_;
      if (!bVar14) {
        if (*(long *)(local_350._56_8_ + -8) == *(long *)(local_350._56_8_ + -0x10) + 1) {
          do {
            pvVar15 = (void *)(local_350._56_8_ + -0x10);
            if (pvVar15 == (void *)local_350._48_8_) {
              bVar14 = true;
              local_350._56_8_ = pvVar15;
              goto LAB_00135cdd;
            }
            plVar2 = (long *)(local_350._56_8_ + -0x20);
            plVar3 = (long *)(local_350._56_8_ + -0x18);
            local_350._56_8_ = pvVar15;
          } while (*plVar3 == *plVar2 + 1);
        }
        *(long *)(local_350._56_8_ + -0x10) = *(long *)(local_350._56_8_ + -0x10) + 1;
        bVar14 = false;
      }
LAB_00135cdd:
      lVar17 = local_350._8_8_ + local_278.stats_.fixtures_;
      local_350._16_8_ = local_350._16_8_ + 1 + local_278.stats_.tests_;
      lVar4 = local_350._24_8_ + local_278.stats_.checks_;
      lVar5 = local_350._32_8_ + local_278.stats_.failedTests_;
      lVar6 = local_350._40_8_ + local_278.stats_.failedChecks_;
      pvVar15 = (void *)local_350._48_8_;
      local_350._40_8_ = lVar6;
      local_350._32_8_ = lVar5;
      local_350._24_8_ = lVar4;
      local_350._8_8_ = lVar17;
    } while (!bVar14);
    if (local_350._16_8_ == 0) {
      local_350._16_8_ = 1;
    }
    uVar12 = local_350._16_8_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d8);
    __return_storage_ptr__ = local_2a8;
    if ((undefined1 *)local_350._88_8_ != local_350 + 0x68) {
      operator_delete((void *)local_350._88_8_,(ulong)(local_350._104_8_ + 1));
    }
    if ((void *)local_350._48_8_ != (void *)0x0) {
      operator_delete((void *)local_350._48_8_,local_350._64_8_ - local_350._48_8_);
    }
    __return_storage_ptr__->fixtures_ = __return_storage_ptr__->fixtures_ + lVar17;
    __return_storage_ptr__->tests_ = uVar12 + __return_storage_ptr__->tests_;
    __return_storage_ptr__->checks_ = __return_storage_ptr__->checks_ + lVar4;
    __return_storage_ptr__->failedTests_ = lVar5 + __return_storage_ptr__->failedTests_;
    __return_storage_ptr__->failedChecks_ = __return_storage_ptr__->failedChecks_ + lVar6;
    psVar16 = local_2b0;
    results.value = local_2b8;
  }
  pRVar7 = ((results.value)->results_).value;
  (*pRVar7->_vptr_Results[6])(pRVar7,__return_storage_ptr__,local_2a0,psVar16);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }